

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str-util.cc
# Opt level: O3

bool tinyusdz::makeUniqueName
               (multiset<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *nameSet,string *name,string *unique_name)

{
  pointer pcVar1;
  char cVar2;
  size_type sVar3;
  size_type sVar4;
  bool bVar5;
  long lVar6;
  char cVar7;
  string __str;
  string new_name;
  long *local_78;
  uint local_70;
  long local_68 [2];
  string *local_58;
  key_type local_50;
  
  if (unique_name != (string *)0x0) {
    sVar3 = ::std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count(&nameSet->_M_t,name);
    if (sVar3 != 0) {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      pcVar1 = (name->_M_dataplus)._M_p;
      local_58 = unique_name;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar1,pcVar1 + name->_M_string_length);
      lVar6 = 0;
      do {
        sVar3 = ::std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count(&nameSet->_M_t,&local_50);
        if (sVar3 == 0) break;
        cVar7 = '\x01';
        if (9 < sVar3) {
          sVar4 = sVar3;
          cVar2 = '\x04';
          do {
            cVar7 = cVar2;
            if (sVar4 < 100) {
              cVar7 = cVar7 + -2;
              goto LAB_002a66be;
            }
            if (sVar4 < 1000) {
              cVar7 = cVar7 + -1;
              goto LAB_002a66be;
            }
            if (sVar4 < 10000) goto LAB_002a66be;
            bVar5 = 99999 < sVar4;
            sVar4 = sVar4 / 10000;
            cVar2 = cVar7 + '\x04';
          } while (bVar5);
          cVar7 = cVar7 + '\x01';
        }
LAB_002a66be:
        local_78 = local_68;
        ::std::__cxx11::string::_M_construct((ulong)&local_78,cVar7);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_78,local_70,sVar3);
        ::std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_78);
        if (local_78 != local_68) {
          operator_delete(local_78,local_68[0] + 1);
        }
        sVar3 = ::std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count(&nameSet->_M_t,&local_50);
        if (sVar3 == 0) {
          ::std::__cxx11::string::_M_assign((string *)local_58);
          bVar5 = true;
          goto LAB_002a6749;
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != 0x400);
      bVar5 = false;
LAB_002a6749:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p == &local_50.field_2) {
        return bVar5;
      }
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      return bVar5;
    }
    ::std::__cxx11::string::_M_assign((string *)unique_name);
  }
  return false;
}

Assistant:

bool makeUniqueName(std::multiset<std::string> &nameSet,
                    const std::string &name, std::string *unique_name) {
  if (!unique_name) {
    return false;
  }

  if (nameSet.count(name) == 0) {
    (*unique_name) = name;
    return 0;
  }

  // Simply add number

  const size_t kMaxLoop = 1024;  // to avoid infinite loop.

  std::string new_name = name;

  size_t cnt = 0;
  while (cnt < kMaxLoop) {
    size_t i = nameSet.count(new_name);
    if (i == 0) {
      // This should not happen though.
      return false;
    }

    new_name += std::to_string(i);

    if (nameSet.count(new_name) == 0) {
      (*unique_name) = new_name;
      return true;
    }

    cnt++;
  }

  return false;
}